

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O2

Var Js::HelperMethodWrapper1(ScriptContext *scriptContext,void *origHelperAddr,Var arg1)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  AutoRegisterIgnoreExceptionWrapper local_30;
  
  if (origHelperAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0x52,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = AutoRegisterIgnoreExceptionWrapper::IsRegistered(scriptContext->threadContext);
  if (bVar2) {
    pvVar4 = (Var)(*(code *)origHelperAddr)(arg1);
    return pvVar4;
  }
  AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper
            (&local_30,scriptContext->threadContext);
  pvVar4 = (Var)(*(code *)origHelperAddr)(arg1);
  AutoRegisterIgnoreExceptionWrapper::~AutoRegisterIgnoreExceptionWrapper(&local_30);
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper1(ScriptContext* scriptContext, void* origHelperAddr, Var arg1)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod1)origHelperAddr)(arg1);
        });
    }